

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O0

char * __thiscall NaParams::GetParam(NaParams *this,char *szParamName)

{
  undefined8 in_RSI;
  long in_RDI;
  char *szParamValue;
  char szNotFound [11];
  item_t *pit;
  item_t it;
  char *local_40;
  char local_33 [11];
  void *local_28;
  undefined1 local_20 [8];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 0;
  builtin_strncpy(local_33,"?not found",0xb);
  local_40 = local_33;
  local_10 = in_RSI;
  local_28 = bsearch(local_20,*(void **)(in_RDI + 0x410),(long)*(int *)(in_RDI + 0x418),0x10,
                     stored_cmp);
  if (local_28 != (void *)0x0) {
    local_40 = *(char **)((long)local_28 + 8);
  }
  NaPrintLog("Query for parameter \'%s\' gives value \'%s\'\n",local_10,local_40);
  return local_40;
}

Assistant:

char*
NaParams::GetParam (const char* szParamName) const
{
  item_t	it, *pit;
  it.name = (char*)szParamName;
  it.value = NULL;

  char	szNotFound[] = "?not found";
  char	*szParamValue = szNotFound;

  pit = (item_t*)bsearch(&it, storage, stored_n, sizeof(item_t), stored_cmp);
  if(NULL != pit)
    szParamValue = pit->value;

  NaPrintLog("Query for parameter '%s' gives value '%s'\n",
	     szParamName, szParamValue);

  return szParamValue;
}